

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O3

string * __thiscall
mg::string::format<char_const*,unsigned_int,char_const*>
          (string *__return_storage_ptr__,string *this,string *format,char *args,uint args_1,
          char *args_2)

{
  int iVar1;
  char cVar2;
  undefined4 in_register_00000084;
  
  iVar1 = snprintf((char *)0x0,0,*(char **)this,format,(ulong)args & 0xffffffff);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar2 = (char)(iVar1 + 1);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,cVar2);
  snprintf((__return_storage_ptr__->_M_dataplus)._M_p,(long)(iVar1 + 1),*(char **)this,format,
           (ulong)args & 0xffffffff,CONCAT44(in_register_00000084,args_1));
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,cVar2 + -1);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const std::string &format, Args... args) {
  size_t size = snprintf(nullptr, 0, format.c_str(), args...) + 1;
  std::string ret;
  ret.resize(size);
  snprintf(&ret[0], size, format.c_str(), args...);
  ret.resize(size - 1);
  return ret;
}